

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakeevaluator.cpp
# Opt level: O3

void __thiscall QMakeEvaluator::skipExpression(QMakeEvaluator *this,ushort **pTokPtr)

{
  ushort uVar1;
  ushort *puVar2;
  ushort *puVar3;
  
  puVar3 = *pTokPtr;
switchD_0027e957_default:
  while( true ) {
    puVar2 = puVar3;
    puVar3 = puVar2 + 1;
    uVar1 = *puVar2;
    if (0xd < uVar1) goto LAB_0027e934;
    if (uVar1 != 1) break;
    (this->m_current).line = puVar2[1];
    puVar3 = puVar2 + 2;
  }
  if (uVar1 != 7) goto LAB_0027e945;
  goto LAB_0027e998;
LAB_0027e934:
  if (uVar1 != 0xe) {
    if (uVar1 == 0xf) {
LAB_0027e998:
      *pTokPtr = puVar3;
      return;
    }
LAB_0027e945:
    switch((char)uVar1) {
    case '\b':
    case '\f':
      puVar3 = puVar2 + (ulong)puVar2[1] + 2;
      break;
    case '\t':
    case '\n':
    case '\v':
      puVar3 = puVar2 + (ulong)puVar2[3] + 4;
      break;
    case '\r':
      *pTokPtr = puVar2 + (ulong)puVar2[3] + 4;
      skipExpression(this,pTokPtr);
      puVar3 = *pTokPtr;
    }
  }
  goto switchD_0027e957_default;
}

Assistant:

void QMakeEvaluator::skipExpression(const ushort *&pTokPtr)
{
    const ushort *tokPtr = pTokPtr;
    forever {
        ushort tok = *tokPtr++;
        switch (tok) {
        case TokLine:
            m_current.line = *tokPtr++;
            break;
        case TokValueTerminator:
        case TokFuncTerminator:
            pTokPtr = tokPtr;
            return;
        case TokArgSeparator:
            break;
        default:
            switch (tok & TokMask) {
            case TokLiteral:
            case TokEnvVar:
                skipStr(tokPtr);
                break;
            case TokHashLiteral:
            case TokVariable:
            case TokProperty:
                skipHashStr(tokPtr);
                break;
            case TokFuncName:
                skipHashStr(tokPtr);
                pTokPtr = tokPtr;
                skipExpression(pTokPtr);
                tokPtr = pTokPtr;
                break;
            default:
                Q_ASSERT_X(false, "skipExpression", "Unrecognized token");
                break;
            }
        }
    }